

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptConversion.cpp
# Opt level: O3

BOOL Js::JavascriptConversion::ToInt32Finite(Var aValue,ScriptContext *scriptContext,int32 *result)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  BOOL BVar5;
  RecyclableObject *pRVar6;
  undefined4 *puVar7;
  JavascriptBoolean *pJVar8;
  JavascriptString *this;
  JavascriptTypedNumber<long> *pJVar9;
  JavascriptTypedNumber<unsigned_long> *pJVar10;
  char *message;
  char *error;
  uint lineNumber;
  double value;
  undefined1 auVar11 [16];
  ScriptContext *local_48;
  
  bVar3 = VarIs<Js::RecyclableObject>(aValue);
  if (bVar3) {
    pRVar6 = UnsafeVarTo<Js::RecyclableObject>(aValue);
    local_48 = (((((pRVar6->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
               scriptContext.ptr;
  }
  else {
    local_48 = (ScriptContext *)0x0;
  }
  bVar3 = true;
  puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
LAB_00a8da04:
  if (aValue == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar4) goto LAB_00a8de5f;
    *puVar7 = 0;
LAB_00a8daa7:
    pRVar6 = UnsafeVarTo<Js::RecyclableObject>(aValue);
    if (pRVar6 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar4) goto LAB_00a8de5f;
      *puVar7 = 0;
    }
    TVar1 = ((pRVar6->type).ptr)->typeId;
    if ((0x57 < (int)TVar1) && (BVar5 = RecyclableObject::IsExternal(pRVar6), BVar5 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar4) goto LAB_00a8de5f;
      *puVar7 = 0;
    }
    switch(TVar1) {
    case TypeIds_Undefined:
      goto switchD_00a8dbd9_caseD_0;
    case TypeIds_Null:
      *result = 0;
      return 1;
    case TypeIds_Boolean:
      pJVar8 = UnsafeVarTo<Js::JavascriptBoolean>(aValue);
      *result = (uint)(pJVar8->value != 0);
      return 1;
    case TypeIds_FirstNumberType:
      bVar3 = ((ulong)aValue & 0xffff000000000000) == 0x1000000000000;
      goto LAB_00a8dd72;
    case TypeIds_Number:
switchD_00a8dbd9_caseD_4:
      if (aValue < (Var)0x4000000000000) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar7 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.h"
                                    ,0xd4,"(Is(aValue))",
                                    "Ensure var is actually a \'JavascriptNumber\'");
        if (!bVar3) goto LAB_00a8de5f;
        *puVar7 = 0;
      }
      value = (double)((ulong)aValue ^ 0xfffc000000000000);
      break;
    case TypeIds_Int64Number:
      pJVar9 = UnsafeVarTo<Js::JavascriptTypedNumber<long>>(aValue);
      value = (double)pJVar9->m_value;
      break;
    case TypeIds_LastNumberType:
      pJVar10 = UnsafeVarTo<Js::JavascriptTypedNumber<unsigned_long>>(aValue);
      auVar11._0_8_ = (double)CONCAT44(0x43300000,(int)pJVar10->m_value);
      auVar11._8_4_ = (int)(pJVar10->m_value >> 0x20);
      auVar11._12_4_ = 0x45300000;
      value = (auVar11._0_8_ - 4503599627370496.0) + (auVar11._8_8_ - 1.9342813113834067e+25);
      break;
    case TypeIds_String:
      this = UnsafeVarTo<Js::JavascriptString>(aValue);
      value = JavascriptString::ToDouble(this);
      break;
    case TypeIds_Symbol:
      JavascriptError::TryThrowTypeError(local_48,scriptContext,-0x7ff5ec77,(PCWSTR)0x0);
switchD_00a8dbd9_caseD_0:
      *result = 0;
      return 0;
    default:
      BVar5 = JavascriptOperators::IsObject(aValue);
      if (BVar5 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar7 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptConversion.cpp"
                                    ,0x45d,"(JavascriptOperators::IsObject(aValue))",
                                    "bad type object in conversion ToInteger32");
        if (!bVar4) goto LAB_00a8de5f;
        *puVar7 = 0;
      }
      if (bVar3) goto code_r0x00a8dbb2;
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptConversion.cpp"
                                  ,0x460,"(0)",
                                  "wrong call in ToInteger32_Full, no dynamic objects should get here"
                                 );
      if (bVar3) {
        *puVar7 = 0;
        JavascriptError::ThrowError(scriptContext,-0x7ff5fe4a,(PCWSTR)0x0);
      }
LAB_00a8de5f:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    BVar5 = ToInt32Finite(value,result);
    return BVar5;
  }
  if (((ulong)aValue & 0x1ffff00000000) == 0x1000000000000 ||
      ((ulong)aValue & 0xffff000000000000) != 0x1000000000000) {
    if (((ulong)aValue & 0xffff000000000000) != 0x1000000000000) {
      if (aValue < (Var)0x4000000000000) goto LAB_00a8daa7;
      goto switchD_00a8dbd9_caseD_4;
    }
    bVar3 = true;
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar3) goto LAB_00a8de5f;
    *puVar7 = 0;
    bVar3 = true;
  }
LAB_00a8dd72:
  if ((bool)(bVar3 ^ 1U | ((ulong)aValue & 0x1ffff00000000) == 0x1000000000000)) {
    if (bVar3) goto LAB_00a8ddf5;
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar7 = 1;
    error = "(Is(aValue))";
    message = "Ensure var is actually a \'TaggedInt\'";
    lineNumber = 0x43;
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar7 = 1;
    error = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
    message = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
    lineNumber = 0x2a;
  }
  bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                              ,lineNumber,error,message);
  if (bVar3) {
    *puVar7 = 0;
LAB_00a8ddf5:
    *result = (int32)aValue;
    return 1;
  }
  goto LAB_00a8de5f;
code_r0x00a8dbb2:
  aValue = ToPrimitive<(Js::JavascriptHint)2>(aValue,scriptContext);
  bVar3 = false;
  goto LAB_00a8da04;
}

Assistant:

BOOL JavascriptConversion::ToInt32Finite(Var aValue, ScriptContext* scriptContext, int32* result)
    {
        ScriptContext * objectScriptContext = VarIs<RecyclableObject>(aValue) ? UnsafeVarTo<RecyclableObject>(aValue)->GetScriptContext() : nullptr;
        BOOL fPrimitiveOnly = false;
        while(true)
        {
            switch (JavascriptOperators::GetTypeId(aValue))
            {
            case TypeIds_Symbol:
                JavascriptError::TryThrowTypeError(objectScriptContext, scriptContext, JSERR_NeedNumber);
                // Fallthrough to return false and set result to 0 if exceptions are disabled
            case TypeIds_Undefined:
                *result = 0;
                return false;

            case TypeIds_Null:
                *result = 0;
                return true;

            case TypeIds_Integer:
                *result = TaggedInt::ToInt32(aValue);
                return true;

            case TypeIds_Boolean:
                *result = UnsafeVarTo<JavascriptBoolean>(aValue)->GetValue() ? 1 : +0;
                return true;

            case TypeIds_Number:
                return ToInt32Finite(JavascriptNumber::GetValue(aValue), result);

            case TypeIds_Int64Number:
                // we won't lose precision if the int64 is within 32bit boundary; otherwise we need to
                // treat it as double anyhow.
                return ToInt32Finite((double)UnsafeVarTo<JavascriptInt64Number>(aValue)->GetValue(), result);

            case TypeIds_UInt64Number:
                // we won't lose precision if the int64 is within 32bit boundary; otherwise we need to
                // treat it as double anyhow.
                return ToInt32Finite((double)UnsafeVarTo<JavascriptUInt64Number>(aValue)->GetValue(), result);

            case TypeIds_String:
                return ToInt32Finite(UnsafeVarTo<JavascriptString>(aValue)->ToDouble(), result);

            default:
                {
                    AssertMsg(JavascriptOperators::IsObject(aValue), "bad type object in conversion ToInteger32");
                    if(fPrimitiveOnly)
                    {
                        AssertMsg(FALSE, "wrong call in ToInteger32_Full, no dynamic objects should get here");
                        JavascriptError::ThrowError(scriptContext, VBSERR_OLENoPropOrMethod);
                    }
                    fPrimitiveOnly = true;
                    aValue = ToPrimitive<JavascriptHint::HintNumber>(aValue, scriptContext);
                }
            }
        }
    }